

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ObjPrintVerboseCone(Aig_Man_t *p,Aig_Obj_t *pRoot,int fHaig)

{
  Vec_Ptr_t *__ptr;
  Aig_Obj_t **ppAVar1;
  long lVar2;
  Aig_Obj_t *local_18;
  
  ppAVar1 = &local_18;
  local_18 = pRoot;
  __ptr = Aig_ManDfsArray(p,&local_18,1);
  if (0 < __ptr->nSize) {
    lVar2 = 0;
    do {
      Aig_ObjPrintVerbose((Aig_Obj_t *)__ptr->pArray[lVar2],(int)ppAVar1);
      putchar(10);
      lVar2 = lVar2 + 1;
    } while (lVar2 < __ptr->nSize);
  }
  putchar(10);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Aig_ObjPrintVerboseCone( Aig_Man_t * p, Aig_Obj_t * pRoot, int fHaig )
{
    extern Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes );
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Aig_ManDfsArray( p, &pRoot, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );

}